

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O3

void __thiscall Database::DatabaseImpl::AddTraffic(DatabaseImpl *this,string *port,string *traffic)

{
  sockaddr *__addr;
  socklen_t in_ECX;
  Statement query;
  Statement local_a0;
  
  __addr = (sockaddr *)time((time_t *)0x0);
  SQLite::Statement::Statement
            (&local_a0,&this->db_,"INSERT INTO traffic VALUES (@port, @result, @traffic)");
  SQLite::Statement::bind(&local_a0,0x184143,(sockaddr *)port,in_ECX);
  SQLite::Statement::bind(&local_a0,0x18410f,__addr,in_ECX);
  SQLite::Statement::bind(&local_a0,0x184117,(sockaddr *)traffic,in_ECX);
  SQLite::Statement::exec(&local_a0);
  SQLite::Statement::~Statement(&local_a0);
  return;
}

Assistant:

void Database::DatabaseImpl::AddTraffic(const string& port, const string& traffic)
{
    time_t result = time(nullptr);
    SQLite::Statement query(db_, "INSERT INTO traffic VALUES (@port, @result, @traffic)");
    query.bind("@port", port);
    query.bind("@result", result);
    query.bind("@traffic", traffic);
    query.exec();
}